

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb_details::internal_node<int,_false>_> __thiscall
immutable::rrb_details::rebalance<int,false,6>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<int,_false>_> *left,
          ref<immutable::rrb_details::internal_node<int,_false>_> *centre,
          ref<immutable::rrb_details::internal_node<int,_false>_> *right,uint32_t shift,bool is_top)

{
  internal_node<int,_false> *piVar1;
  ref<immutable::rrb_details::internal_node<int,_false>_> new_left;
  uint32_t top_len;
  ref<immutable::rrb_details::internal_node<int,_false>_> new_all;
  ref<immutable::rrb_details::internal_node<int,_false>_> all;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_48;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_40;
  ref<immutable::rrb_details::internal_node<int,_false>_> new_right;
  vector<unsigned_int,_std::allocator<unsigned_int>_> node_count;
  
  all.ptr = internal_node_merge<int,false>(left,centre,right);
  if (all.ptr != (internal_node<int,_false> *)0x0) {
    (all.ptr)->_ref_count = 1;
  }
  create_concat_plan<int,false,6>
            (&node_count,(rrb_details *)&all,
             (ref<immutable::rrb_details::internal_node<int,_false>_> *)&top_len,(uint32_t *)right);
  execute_concat_plan<int,false,6>((rrb_details *)&new_all,&all,&node_count,top_len,shift);
  if (top_len < 0x41) {
    if (is_top) {
      *(internal_node<int,_false> **)this = new_all.ptr;
      if (new_all.ptr != (internal_node<int,_false> *)0x0) {
        (new_all.ptr)->_ref_count = (new_all.ptr)->_ref_count + 1;
      }
      goto LAB_00145fe0;
    }
    set_sizes<int,false,6>((rrb_details *)&new_left,&new_all,shift);
    piVar1 = internal_node_new_above1<int,false>(&new_left);
    *(internal_node<int,_false> **)this = piVar1;
    if (piVar1 != (internal_node<int,_false> *)0x0) {
      piVar1->_ref_count = 1;
    }
  }
  else {
    new_left.ptr = internal_node_copy<int,false>(new_all.ptr,0,0x40);
    if (new_left.ptr != (internal_node<int,_false> *)0x0) {
      (new_left.ptr)->_ref_count = 1;
    }
    new_right.ptr = internal_node_copy<int,false>(new_all.ptr,0x40,top_len - 0x40);
    if (new_right.ptr != (internal_node<int,_false> *)0x0) {
      (new_right.ptr)->_ref_count = 1;
    }
    set_sizes<int,false,6>((rrb_details *)&local_40,&new_left,shift);
    set_sizes<int,false,6>((rrb_details *)&local_48,&new_right,shift);
    piVar1 = internal_node_new_above<int,false>(&local_40,&local_48);
    *(internal_node<int,_false> **)this = piVar1;
    if (piVar1 != (internal_node<int,_false> *)0x0) {
      piVar1->_ref_count = 1;
    }
    ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_48);
    ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_40);
    ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&new_right);
  }
  ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&new_left);
LAB_00145fe0:
  ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&new_all);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&node_count.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&all);
  return (ref<immutable::rrb_details::internal_node<int,_false>_>)(internal_node<int,_false> *)this;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> rebalance(const ref<internal_node<T, atomic_ref_counting>>& left, const ref<internal_node<T, atomic_ref_counting>>& centre, const ref<internal_node<T, atomic_ref_counting>>& right, uint32_t shift, bool is_top)
      {
      ref<internal_node<T, atomic_ref_counting>> all = internal_node_merge(left, centre, right);
      // top_len is children count of the internal node returned.
      uint32_t top_len; // populated through pointer manipulation.

      std::vector<uint32_t> node_count = create_concat_plan<T, atomic_ref_counting, N>(all, &top_len);

      ref<internal_node<T, atomic_ref_counting>> new_all = execute_concat_plan<T, atomic_ref_counting, N>(all, node_count, top_len, shift);
      if (top_len <= bits<N>::rrb_branching)
        {
        if (is_top == false)
          {
          return internal_node_new_above1(set_sizes<T, atomic_ref_counting, N>(new_all, shift));
          }
        else
          {
          return new_all;
          }
        }
      else
        {
        ref<internal_node<T, atomic_ref_counting>> new_left = internal_node_copy(new_all.ptr, 0, bits<N>::rrb_branching);
        ref<internal_node<T, atomic_ref_counting>> new_right = internal_node_copy(new_all.ptr, bits<N>::rrb_branching, top_len - bits<N>::rrb_branching);
        return internal_node_new_above<T, atomic_ref_counting>(set_sizes<T, atomic_ref_counting, N>(new_left, shift), set_sizes<T, atomic_ref_counting, N>(new_right, shift));
        }
      }